

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int ffgiet(fitsfile *fptr,int *imgtype,int *status)

{
  int iVar1;
  double local_60;
  double max_val;
  double min_val;
  double bzero;
  double bscale;
  long lngzero;
  long lngscale;
  int *piStack_28;
  int tstatus;
  int *status_local;
  int *imgtype_local;
  fitsfile *fptr_local;
  
  bscale = 0.0;
  if (0 < *status) {
    return *status;
  }
  piStack_28 = status;
  status_local = imgtype;
  imgtype_local = &fptr->HDUposition;
  if (fptr->HDUposition == fptr->Fptr->curhdu) {
    if ((fptr->Fptr->datastart == -1) && (iVar1 = ffrdef(fptr,status), 0 < iVar1)) {
      return *piStack_28;
    }
  }
  else {
    ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
  }
  ffmaky((fitsfile *)imgtype_local,2,piStack_28);
  if (*(int *)(*(long *)(imgtype_local + 2) + 0x58) == 0) {
    ffgky((fitsfile *)imgtype_local,0x1f,"BITPIX",status_local,(char *)0x0,piStack_28);
  }
  else {
    if (*(int *)(*(long *)(imgtype_local + 2) + 0x47c) == 0) {
      *piStack_28 = 0xe9;
      return *piStack_28;
    }
    ffgky((fitsfile *)imgtype_local,0x1f,"ZBITPIX",status_local,(char *)0x0,piStack_28);
  }
  lngscale._4_4_ = 0;
  ffgky((fitsfile *)imgtype_local,0x52,"BSCALE",&bzero,(char *)0x0,(int *)((long)&lngscale + 4));
  if (lngscale._4_4_ != 0) {
    bzero = 1.0;
  }
  lngscale._4_4_ = 0;
  ffgky((fitsfile *)imgtype_local,0x52,"BZERO",&min_val,(char *)0x0,(int *)((long)&lngscale + 4));
  if (lngscale._4_4_ != 0) {
    min_val = 0.0;
  }
  if ((((bzero == 1.0) && (!NAN(bzero))) && (min_val == 0.0)) && (!NAN(min_val))) {
    return *piStack_28;
  }
  iVar1 = *status_local;
  if (iVar1 == 8) {
    max_val = 0.0;
    local_60 = 255.0;
  }
  else if (iVar1 == 0x10) {
    max_val = -32768.0;
    local_60 = 32767.0;
  }
  else {
    if (iVar1 != 0x20) {
      return *piStack_28;
    }
    max_val = -2147483648.0;
    local_60 = 2147483647.0;
  }
  if (bzero < 0.0) {
    local_60 = bzero * max_val + min_val;
    max_val = local_60;
  }
  else {
    local_60 = bzero * local_60 + min_val;
  }
  max_val = bzero * max_val + min_val;
  if (min_val < 2147483648.0) {
    bscale = (double)(long)min_val;
  }
  if ((min_val != 2147483648.0) || (NAN(min_val))) {
    if (((double)(long)bscale == min_val) && (!NAN((double)(long)bscale) && !NAN(min_val))) {
      if (((double)(long)bzero == bzero) && (!NAN((double)(long)bzero) && !NAN(bzero)))
      goto LAB_001c3859;
    }
    if ((*status_local == 8) || (*status_local == 0x10)) {
      *status_local = -0x20;
    }
    else {
      *status_local = -0x40;
    }
  }
  else {
LAB_001c3859:
    if ((((max_val != -128.0) || (NAN(max_val))) || (local_60 != 127.0)) || (NAN(local_60))) {
      if ((max_val < -32768.0) || (32767.0 < local_60)) {
        if ((max_val < 0.0) || (65535.0 < local_60)) {
          if ((max_val < -2147483648.0) || (2147483647.0 < local_60)) {
            if ((max_val < 0.0) || (4294967296.0 <= local_60)) {
              *status_local = -0x40;
            }
            else {
              *status_local = 0x28;
            }
          }
          else {
            *status_local = 0x20;
          }
        }
        else {
          *status_local = 0x14;
        }
      }
      else {
        *status_local = 0x10;
      }
    }
    else {
      *status_local = 10;
    }
  }
  return *piStack_28;
}

Assistant:

int ffgiet( fitsfile *fptr,  /* I - FITS file pointer                       */
            int  *imgtype,   /* O - image data type                         */
            int  *status)    /* IO - error status                           */
/*
  Get the effective datatype of the image (= BITPIX keyword for normal image,
  or ZBITPIX for a compressed image)
*/
{
    int tstatus;
    long lngscale, lngzero = 0;
    double bscale, bzero, min_val, max_val;

    if (*status > 0)
        return(*status);

    /* reset position to the correct HDU if necessary */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);
    else if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
        if ( ffrdef(fptr, status) > 0)               /* rescan header */
            return(*status);

    /* reset to beginning of header */
    ffmaky(fptr, 2, status);  /* simply move to beginning of header */

    if ((fptr->Fptr)->hdutype == IMAGE_HDU)
    {
        ffgky(fptr, TINT, "BITPIX", imgtype, NULL, status);
    }
    else if ((fptr->Fptr)->compressimg)
    {
        /* this is a binary table containing a compressed image */
        ffgky(fptr, TINT, "ZBITPIX", imgtype, NULL, status);
    }
    else
    {
        *status = NOT_IMAGE;
        return(*status);

    }

    /* check if the BSCALE and BZERO keywords are defined, which might
       change the effective datatype of the image  */
    tstatus = 0;
    ffgky(fptr, TDOUBLE, "BSCALE", &bscale, NULL, &tstatus);
    if (tstatus)
           bscale = 1.0;

    tstatus = 0;
    ffgky(fptr, TDOUBLE, "BZERO", &bzero, NULL, &tstatus);
    if (tstatus)
           bzero = 0.0;

    if (bscale == 1.0 && bzero == 0.0)  /* no scaling */
        return(*status);

    switch (*imgtype)
    {
      case BYTE_IMG:   /* 8-bit image */
        min_val = 0.;
        max_val = 255.0;
        break;

      case SHORT_IMG:
        min_val = -32768.0;
        max_val =  32767.0;
        break;
        
      case LONG_IMG:

        min_val = -2147483648.0;
        max_val =  2147483647.0;
        break;
        
      default:  /* don't have to deal with other data types */
        return(*status);
    }

    if (bscale >= 0.) {
        min_val = bzero + bscale * min_val;
        max_val = bzero + bscale * max_val;
    } else {
        max_val = bzero + bscale * min_val;
        min_val = bzero + bscale * max_val;
    }
    if (bzero < 2147483648.)  /* don't exceed range of 32-bit integer */
       lngzero = (long) bzero;
    lngscale = (long) bscale;

    if ((bzero != 2147483648.) && /* special value that exceeds integer range */
       (lngzero != bzero || lngscale != bscale)) { /* not integers? */
       /* floating point scaled values; just decide on required precision */
       if (*imgtype == BYTE_IMG || *imgtype == SHORT_IMG)
          *imgtype = FLOAT_IMG;
       else
         *imgtype = DOUBLE_IMG;

    /*
       In all the remaining cases, BSCALE and BZERO are integers,
       and not equal to 1 and 0, respectively.  
    */

    } else if ((min_val == -128.) && (max_val == 127.)) {
       *imgtype = SBYTE_IMG;

    } else if ((min_val >= -32768.0) && (max_val <= 32767.0)) {
       *imgtype = SHORT_IMG;

    } else if ((min_val >= 0.0) && (max_val <= 65535.0)) {
       *imgtype = USHORT_IMG;

    } else if ((min_val >= -2147483648.0) && (max_val <= 2147483647.0)) {
       *imgtype = LONG_IMG;

    } else if ((min_val >= 0.0) && (max_val < 4294967296.0)) {
       *imgtype = ULONG_IMG;

    } else {  /* exceeds the range of a 32-bit integer */
       *imgtype = DOUBLE_IMG;
    }   

    return(*status);
}